

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_tar_empty.c
# Opt level: O0

void test_write_format_tar_empty(void)

{
  int iVar1;
  archive *paVar2;
  uint local_824;
  ulong uStack_820;
  uint i;
  size_t used;
  char buff [2048];
  archive *a;
  
  paVar2 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L'\'',(uint)(paVar2 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paVar2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L'(',(uint)(iVar1 == 0),"0 == archive_write_set_format_ustar(a)",paVar2);
  iVar1 = archive_write_add_filter_none(paVar2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L')',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",paVar2);
  iVar1 = archive_write_set_bytes_per_block(paVar2,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L'*',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_per_block(a, 512)",paVar2)
  ;
  iVar1 = archive_write_set_bytes_in_last_block(paVar2,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L'+',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_in_last_block(a, 512)",
                   paVar2);
  iVar1 = archive_write_open_memory(paVar2,&used,0x800,&stack0xfffffffffffff7e0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L',',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar2);
  iVar1 = archive_write_close(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                      ,L'/',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar2);
  iVar1 = archive_write_free(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                      ,L'0',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L'2',(uint)(uStack_820 == 0x400),"used == 1024",(void *)0x0);
  for (local_824 = 0; local_824 < uStack_820; local_824 = local_824 + 1) {
    failure("Empty tar archive should be all nulls.");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                     ,L'5',(uint)(buff[(ulong)local_824 - 8] == '\0'),"buff[i] == 0",(void *)0x0);
  }
  paVar2 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L'9',(uint)(paVar2 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_pax(paVar2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L':',(uint)(iVar1 == 0),"0 == archive_write_set_format_pax(a)",paVar2);
  iVar1 = archive_write_add_filter_none(paVar2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L';',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",paVar2);
  iVar1 = archive_write_set_bytes_per_block(paVar2,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L'<',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_per_block(a, 512)",paVar2)
  ;
  iVar1 = archive_write_set_bytes_in_last_block(paVar2,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L'=',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_in_last_block(a, 512)",
                   paVar2);
  iVar1 = archive_write_open_memory(paVar2,&used,0x800,&stack0xfffffffffffff7e0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                   ,L'>',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar2);
  iVar1 = archive_write_close(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                      ,L'A',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar2);
  iVar1 = archive_write_free(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                      ,L'B',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                      ,L'D',(long)(int)uStack_820,"(int)used",0x400,"1024",(void *)0x0);
  for (local_824 = 0; local_824 < uStack_820; local_824 = local_824 + 1) {
    failure("Empty tar archive should be all nulls.");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_empty.c"
                     ,L'G',(uint)(buff[(ulong)local_824 - 8] == '\0'),"buff[i] == 0",(void *)0x0);
  }
  return;
}

Assistant:

DEFINE_TEST(test_write_format_tar_empty)
{
	struct archive *a;
	char buff[2048];
	size_t used;
	unsigned int i;

	/* USTAR format: Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_ustar(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_set_bytes_per_block(a, 512));
	assertA(0 == archive_write_set_bytes_in_last_block(a, 512));
	assertA(0 == archive_write_open_memory(a, buff, sizeof(buff), &used));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert(used == 1024);
	for (i = 0; i < used; i++) {
		failure("Empty tar archive should be all nulls.");
		assert(buff[i] == 0);
	}

	/* PAX format: Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_pax(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_set_bytes_per_block(a, 512));
	assertA(0 == archive_write_set_bytes_in_last_block(a, 512));
	assertA(0 == archive_write_open_memory(a, buff, sizeof(buff), &used));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assertEqualInt((int)used, 1024);
	for (i = 0; i < used; i++) {
		failure("Empty tar archive should be all nulls.");
		assert(buff[i] == 0);
	}
}